

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall
Corrade::Utility::String::replaceAll
          (String *__return_storage_ptr__,String *this,StringView string,StringView search,
          StringView replace)

{
  StringView substring;
  bool bVar1;
  char *end;
  ostream *poVar2;
  char *pcVar3;
  BasicStringView<const_char> BVar4;
  ArrayView<char> AVar5;
  type values;
  type values_00;
  type values_01;
  Flags local_169;
  Error local_168;
  _func_void_char_ptr_unsigned_long *local_140;
  _func_void_char_ptr_size_t *deleter;
  size_t size;
  ArrayView<char> local_128;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_118;
  char *local_110;
  BasicStringView<const_char> local_108;
  ArrayView<char> local_f8;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_e8;
  char *local_e0;
  char *local_d8;
  size_t local_d0;
  BasicStringView<const_char> local_c8;
  Array<char,_void_(*)(char_*,_unsigned_long)> *local_b8;
  char *local_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined1 local_98 [8];
  StringView found;
  Array<char,_void_(*)(char_*,_unsigned_long)> output;
  Flags local_59;
  Error local_58;
  undefined1 auStack_30 [8];
  StringView search_local;
  StringView string_local;
  
  search_local._data = search._data;
  auStack_30 = (undefined1  [8])string._sizePlusFlags;
  search_local._sizePlusFlags = (size_t)this;
  bVar1 = Containers::BasicStringView<const_char>::isEmpty
                    ((BasicStringView<const_char> *)auStack_30);
  if (bVar1) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_59);
    Error::Error(&local_58,poVar2,local_59);
    Debug::operator<<(&local_58.super_Debug,
                      "Utility::String::replaceAll(): empty search string would cause an infinite loop"
                     );
    Error::~Error(&local_58);
    abort();
  }
  Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::Array
            ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags);
  BVar4._sizePlusFlags = local_108._sizePlusFlags;
  BVar4._data = local_108._data;
  while( true ) {
    local_a8 = (char *)auStack_30;
    pcStack_a0 = search_local._data;
    substring._sizePlusFlags = (size_t)search_local._data;
    substring._data = (char *)auStack_30;
    local_108 = BVar4;
    BVar4 = Containers::BasicStringView<const_char>::find
                      ((BasicStringView<const_char> *)&search_local._sizePlusFlags,substring);
    found._data = (char *)BVar4._sizePlusFlags;
    pcVar3 = BVar4._data;
    local_98 = (undefined1  [8])pcVar3;
    bVar1 = Containers::BasicStringView::operator_cast_to_bool((BasicStringView *)local_98);
    if (!bVar1) break;
    pcVar3 = Containers::BasicStringView<const_char>::begin((BasicStringView<const_char> *)local_98)
    ;
    BVar4 = Containers::BasicStringView<const_char>::prefix<const_char_*,_0>
                      ((BasicStringView<const_char> *)&search_local._sizePlusFlags,pcVar3);
    local_c8._sizePlusFlags = BVar4._sizePlusFlags;
    pcVar3 = BVar4._data;
    local_c8._data = pcVar3;
    Containers::ArrayView<char_const>::
    ArrayView<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayView<char_const>>
              ((ArrayView<char_const> *)&local_b8,&local_c8);
    values._size = (size_t)pcVar3;
    values._data = local_b0;
    AVar5 = Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                      ((Containers *)&found._sizePlusFlags,local_b8,values);
    local_d0 = AVar5._size;
    pcVar3 = AVar5._data;
    local_d8 = pcVar3;
    Containers::ArrayView<char_const>::
    ArrayView<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::ArrayView<char_const>>
              ((ArrayView<char_const> *)&local_e8,&replace);
    values_00._size = (size_t)pcVar3;
    values_00._data = local_e0;
    AVar5 = Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                      ((Containers *)&found._sizePlusFlags,local_e8,values_00);
    local_f8 = AVar5;
    pcVar3 = Containers::BasicStringView<const_char>::end((BasicStringView<const_char> *)local_98);
    end = Containers::BasicStringView<const_char>::end
                    ((BasicStringView<const_char> *)&search_local._sizePlusFlags);
    BVar4 = Containers::BasicStringView<const_char>::slice
                      ((BasicStringView<const_char> *)&search_local._sizePlusFlags,pcVar3,end);
    search_local._sizePlusFlags = (size_t)BVar4._data;
  }
  Containers::ArrayView<char_const>::
  ArrayView<Corrade::Containers::BasicStringView<char_const>&,Corrade::Containers::ArrayView<char_const>>
            ((ArrayView<char_const> *)&local_118,
             (BasicStringView<const_char> *)&search_local._sizePlusFlags);
  values_01._size = (size_t)pcVar3;
  values_01._data = local_110;
  local_128 = Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
                        ((Containers *)&found._sizePlusFlags,local_118,values_01);
  size._7_1_ = 0;
  Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
            ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags,
             (type_conflict3 *)((long)&size + 7));
  deleter = (_func_void_char_ptr_size_t *)
            Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::size
                      ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags);
  local_140 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::deleter
                        ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags);
  if (local_140 == (_func_void_char_ptr_unsigned_long *)0x0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_169);
    Error::Error(&local_168,poVar2,local_169);
    Debug::operator<<(&local_168.super_Debug,
                      "Assertion deleter failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/String.cpp:1110"
                     );
    Error::~Error(&local_168);
    abort();
  }
  pcVar3 = Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::release
                     ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags);
  Containers::String::String
            (__return_storage_ptr__,pcVar3,(size_t)(deleter + -1),
             (_func_void_char_ptr_size_t *)local_140);
  Containers::Array<char,_void_(*)(char_*,_unsigned_long)>::~Array
            ((Array<char,_void_(*)(char_*,_unsigned_long)> *)&found._sizePlusFlags);
  return __return_storage_ptr__;
}

Assistant:

Containers::String replaceAll(Containers::StringView string, const Containers::StringView search, const Containers::StringView replace) {
    CORRADE_ASSERT(!search.isEmpty(),
        "Utility::String::replaceAll(): empty search string would cause an infinite loop", {});
    Containers::Array<char> output;
    while(const Containers::StringView found = string.find(search)) {
        arrayAppend(output, string.prefix(found.begin()));
        arrayAppend(output, replace);
        string = string.slice(found.end(), string.end());
    }
    arrayAppend(output, string);
    arrayAppend(output, '\0');
    const std::size_t size = output.size();
    /* This assumes that the growable array uses std::malloc() (which has to be
       std::free()'d later) in order to be able to std::realloc(). The deleter
       doesn't use the size argument so it should be fine to transfer it over
       to a String with the size excluding the null terminator. */
    void(*const deleter)(char*, std::size_t) = output.deleter();
    CORRADE_INTERNAL_ASSERT(deleter);
    return Containers::String{output.release(), size - 1, deleter};
}